

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

void scalar_inverse_ntt(scalar *s)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int j;
  long lVar9;
  long lVar10;
  int i;
  
  iVar5 = 2;
  uVar7 = 0x80;
  do {
    uVar7 = uVar7 >> 1;
    lVar8 = (long)iVar5;
    iVar5 = iVar5 * 2;
    uVar6 = 0;
    lVar10 = 0;
    do {
      uVar1 = kInverseNTTRoots[uVar6 + uVar7];
      lVar9 = lVar10;
      do {
        uVar2 = s->c[lVar8 + lVar9];
        uVar3 = s->c[lVar9];
        uVar4 = reduce_once(uVar3 + uVar2);
        s->c[lVar9] = uVar4;
        uVar4 = reduce((((uint)uVar3 - (uint)uVar2) + 0xd01) * (uint)uVar1);
        s->c[lVar8 + lVar9] = uVar4;
        lVar9 = lVar9 + 1;
      } while (lVar9 < lVar8 + lVar10);
      lVar10 = lVar10 + iVar5;
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  } while (iVar5 < 0x100);
  lVar8 = 0;
  do {
    uVar4 = reduce((uint)s->c[lVar8] * 0xce7);
    s->c[lVar8] = uVar4;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  return;
}

Assistant:

static void scalar_inverse_ntt(scalar *s) {
  int step = DEGREE / 2;
  // `int` is used here because using `size_t` throughout caused a ~5% slowdown
  // with Clang 14 on Aarch64.
  for (int offset = 2; offset < DEGREE; offset <<= 1) {
    step >>= 1;
    int k = 0;
    for (int i = 0; i < step; i++) {
      uint32_t step_root = kInverseNTTRoots[i + step];
      for (int j = k; j < k + offset; j++) {
        uint16_t odd = s->c[j + offset];
        uint16_t even = s->c[j];
        s->c[j] = reduce_once(odd + even);
        s->c[j + offset] = reduce(step_root * (even - odd + kPrime));
      }
      k += 2 * offset;
    }
  }
  for (int i = 0; i < DEGREE; i++) {
    s->c[i] = reduce(s->c[i] * kInverseDegree);
  }
}